

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPrimalHeuristics.cpp
# Opt level: O0

void __thiscall
HighsPrimalHeuristics::HighsPrimalHeuristics(HighsPrimalHeuristics *this,HighsMipSolver *mipsolver)

{
  HighsRandom *in_RSI;
  undefined8 *in_RDI;
  
  *in_RDI = in_RSI;
  in_RDI[1] = 0;
  in_RDI[2] = 0;
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  HighsRandom::HighsRandom(in_RSI,(HighsUInt)((ulong)in_RDI >> 0x20));
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x66e6a4);
  in_RDI[5] = 0;
  *(undefined4 *)(in_RDI + 6) = 0;
  in_RDI[7] = 0;
  *(undefined4 *)(in_RDI + 8) = 0;
  return;
}

Assistant:

HighsPrimalHeuristics::HighsPrimalHeuristics(HighsMipSolver& mipsolver)
    : mipsolver(mipsolver),
      total_repair_lp(0),
      total_repair_lp_feasible(0),
      total_repair_lp_iterations(0),
      lp_iterations(0),
      randgen(mipsolver.options_mip_->random_seed) {
  successObservations = 0;
  numSuccessObservations = 0;
  infeasObservations = 0;
  numInfeasObservations = 0;
}